

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

string * __thiscall
ot::commissioner::Interpreter::ToString_abi_cxx11_
          (string *__return_storage_ptr__,Interpreter *this,State *aState)

{
  ushort uVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  char *pcVar6;
  ulong uVar7;
  undefined8 uVar8;
  string __str_2;
  string __str_1;
  string __str;
  char *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  string local_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  char *local_58;
  uint local_50;
  char local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar1 = *(ushort *)
           &(this->mContext).mNwkAliases.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_58 = local_48;
  std::__cxx11::string::_M_construct((ulong)&local_58,'\x01');
  std::__detail::__to_chars_10_impl<unsigned_int>(local_58,local_50,uVar1 & 7);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x229243);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_68 = *plVar4;
    lStack_60 = plVar2[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar4;
    local_78 = (long *)*plVar2;
  }
  local_70 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_78);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_c8 = *puVar5;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar5;
    local_d8 = (ulong *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  BaConnModeToString_abi_cxx11_
            (&local_98,
             (Interpreter *)
             (ulong)(*(ushort *)
                      &(this->mContext).mNwkAliases.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start & 7),(uint32_t)local_d0);
  uVar7 = 0xf;
  if (local_d8 != &local_c8) {
    uVar7 = local_c8;
  }
  if (uVar7 < local_98._M_string_length + local_d0) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar8 = local_98.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_98._M_string_length + local_d0) goto LAB_0013aed3;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_d8);
  }
  else {
LAB_0013aed3:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_98._M_dataplus._M_p);
  }
  local_f8 = (char *)&local_e8;
  pcVar6 = (char *)(puVar3 + 2);
  if ((char *)*puVar3 == pcVar6) {
    local_e8 = *(undefined8 *)pcVar6;
    uStack_e0 = puVar3[3];
  }
  else {
    local_e8 = *(undefined8 *)pcVar6;
    local_f8 = (char *)*puVar3;
  }
  local_f0 = puVar3[1];
  *puVar3 = pcVar6;
  puVar3[1] = 0;
  *pcVar6 = '\0';
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_a8 = *plVar4;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar4;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_f8 != (char *)&local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  uVar1 = *(ushort *)
           &(this->mContext).mNwkAliases.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_58 = local_48;
  std::__cxx11::string::_M_construct((ulong)&local_58,'\x01');
  std::__detail::__to_chars_10_impl<unsigned_int>(local_58,local_50,uVar1 >> 3 & 3);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x22925b);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_68 = *plVar4;
    lStack_60 = plVar2[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar4;
    local_78 = (long *)*plVar2;
  }
  local_70 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_78);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_c8 = *puVar5;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar5;
    local_d8 = (ulong *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  BaThreadIfStatusToString_abi_cxx11_
            (&local_98,
             (Interpreter *)
             (ulong)(*(uint *)&(this->mContext).mNwkAliases.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3 & 3),
             (uint32_t)local_d0);
  uVar7 = 0xf;
  if (local_d8 != &local_c8) {
    uVar7 = local_c8;
  }
  if (uVar7 < local_98._M_string_length + local_d0) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar8 = local_98.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_98._M_string_length + local_d0) goto LAB_0013b16b;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_d8);
  }
  else {
LAB_0013b16b:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_98._M_dataplus._M_p);
  }
  pcVar6 = (char *)(puVar3 + 2);
  if ((char *)*puVar3 == pcVar6) {
    local_e8 = *(undefined8 *)pcVar6;
    uStack_e0 = puVar3[3];
    local_f8 = (char *)&local_e8;
  }
  else {
    local_e8 = *(undefined8 *)pcVar6;
    local_f8 = (char *)*puVar3;
  }
  local_f0 = puVar3[1];
  *puVar3 = pcVar6;
  puVar3[1] = 0;
  *pcVar6 = '\0';
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_a8 = *plVar4;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar4;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_f8 != (char *)&local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  uVar1 = *(ushort *)
           &(this->mContext).mNwkAliases.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_58 = local_48;
  std::__cxx11::string::_M_construct((ulong)&local_58,'\x01');
  std::__detail::__to_chars_10_impl<unsigned_int>(local_58,local_50,uVar1 >> 5 & 3);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x229271);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_68 = *plVar4;
    lStack_60 = plVar2[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar4;
    local_78 = (long *)*plVar2;
  }
  local_70 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_78);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_c8 = *puVar5;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar5;
    local_d8 = (ulong *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  BaAvailabilityToString_abi_cxx11_
            (&local_98,
             (Interpreter *)
             (ulong)(*(uint *)&(this->mContext).mNwkAliases.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5 & 3),
             (uint32_t)local_d0);
  uVar7 = 0xf;
  if (local_d8 != &local_c8) {
    uVar7 = local_c8;
  }
  if (uVar7 < local_98._M_string_length + local_d0) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar8 = local_98.field_2._M_allocated_capacity;
    }
    if (local_98._M_string_length + local_d0 <= (ulong)uVar8) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_d8);
      goto LAB_0013b416;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_98._M_dataplus._M_p);
LAB_0013b416:
  pcVar6 = (char *)(puVar3 + 2);
  if ((char *)*puVar3 == pcVar6) {
    local_e8 = *(undefined8 *)pcVar6;
    uStack_e0 = puVar3[3];
    local_f8 = (char *)&local_e8;
  }
  else {
    local_e8 = *(undefined8 *)pcVar6;
    local_f8 = (char *)*puVar3;
  }
  local_f0 = puVar3[1];
  *puVar3 = pcVar6;
  puVar3[1] = 0;
  *pcVar6 = '\0';
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_a8 = *plVar4;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar4;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_f8 != (char *)&local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  uVar1 = *(ushort *)
           &(this->mContext).mNwkAliases.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_d8 = &local_c8;
  std::__cxx11::string::_M_construct((ulong)&local_d8,'\x01');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_d8,(uint)local_d0,uVar1 >> 7 & 1);
  puVar3 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,0x229285);
  pcVar6 = (char *)(puVar3 + 2);
  if ((char *)*puVar3 == pcVar6) {
    local_e8 = *(undefined8 *)pcVar6;
    uStack_e0 = puVar3[3];
    local_f8 = (char *)&local_e8;
  }
  else {
    local_e8 = *(undefined8 *)pcVar6;
    local_f8 = (char *)*puVar3;
  }
  local_f0 = puVar3[1];
  *puVar3 = pcVar6;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_a8 = *plVar4;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar4;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_f8 != (char *)&local_e8) {
    operator_delete(local_f8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  uVar1 = *(ushort *)
           &(this->mContext).mNwkAliases.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_f8 = (char *)&local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\x01');
  std::__detail::__to_chars_10_impl<unsigned_int>(local_f8,(uint)local_f0,uVar1 >> 8 & 1);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,0x229298);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_a8 = *plVar4;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar4;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_f8 != (char *)&local_e8) {
    operator_delete(local_f8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::ToString(const BorderAgent::State &aState)
{
    std::string ret;
    ret += "State.ConnectionMode=" + std::to_string(aState.mConnectionMode) + "(" +
           BaConnModeToString(aState.mConnectionMode) + ")\n";
    ret += "State.ThreadIfStatus=" + std::to_string(aState.mThreadIfStatus) + "(" +
           BaThreadIfStatusToString(aState.mThreadIfStatus) + ")\n";
    ret += "State.Availability=" + std::to_string(aState.mAvailability) + "(" +
           BaAvailabilityToString(aState.mAvailability) + ")\n";
    ret += "State.BbrIsActive=" + std::to_string(aState.mBbrIsActive) + "\n";
    ret += "State.BbrIsPrimary=" + std::to_string(aState.mBbrIsPrimary);
    return ret;
}